

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O3

StringSet * __thiscall
OSTEI_VRR_Algorithm_Base::GetVarReq_abi_cxx11_
          (StringSet *__return_storage_ptr__,OSTEI_VRR_Algorithm_Base *this,QAM *am)

{
  _Rb_tree_color rrstep;
  pointer pcVar1;
  mapped_type *pmVar2;
  OSTEI_VRR_Algorithm_Base *this_00;
  undefined1 local_88 [16];
  _Alloc_hider local_78;
  char local_68 [16];
  undefined1 local_58 [16];
  _Alloc_hider local_48;
  char local_38 [16];
  
  local_58._0_4_ = (am->qam)._M_elems[0];
  local_58._4_4_ = (am->qam)._M_elems[1];
  local_58._8_4_ = (am->qam)._M_elems[2];
  local_58._12_4_ = (am->qam)._M_elems[3];
  pcVar1 = (am->tag)._M_dataplus._M_p;
  local_48._M_p = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (am->tag)._M_string_length);
  pmVar2 = std::
           map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
           ::at(&this->vrrmap_,(key_type *)local_58);
  rrstep = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  local_88._0_4_ = (am->qam)._M_elems[0];
  local_88._4_4_ = (am->qam)._M_elems[1];
  local_88._8_4_ = (am->qam)._M_elems[2];
  local_88._12_4_ = (am->qam)._M_elems[3];
  this_00 = (OSTEI_VRR_Algorithm_Base *)(am->tag)._M_dataplus._M_p;
  local_78._M_p = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,this_00,
             (long)(&(this_00->info_).super_GeneratorInfoBase.finalam_.qam + 0xffffffffffffffff) +
             (am->tag)._M_string_length);
  GenerateVarReq_abi_cxx11_(__return_storage_ptr__,this_00,(QAM *)local_88,rrstep);
  if (local_78._M_p != local_68) {
    operator_delete(local_78._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

StringSet OSTEI_VRR_Algorithm_Base::GetVarReq(QAM am) const
{
    RRStepType rrstep = GetRRStep(am);
    return GenerateVarReq(am, rrstep);
}